

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall
amrex::BaseFab<amrex::EBCellFlag>::BaseFab
          (BaseFab<amrex::EBCellFlag> *this,Box *bx,int n,bool alloc,bool shared,Arena *ar)

{
  byte in_CL;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  BaseFab<amrex::EBCellFlag> *in_R9;
  
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 1),(Arena *)in_R9);
  *in_RDI = &PTR__BaseFab_01801ef0;
  in_RDI[2] = 0;
  in_RDI[3] = *in_RSI;
  in_RDI[4] = in_RSI[1];
  in_RDI[5] = in_RSI[2];
  *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(in_RSI + 3);
  *(undefined4 *)((long)in_RDI + 0x34) = in_EDX;
  in_RDI[7] = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  *(byte *)((long)in_RDI + 0x41) = in_R8B & 1;
  if (((*(byte *)((long)in_RDI + 0x41) & 1) == 0) && ((in_CL & 1) != 0)) {
    define(in_R9);
  }
  return;
}

Assistant:

BaseFab<T>::BaseFab (const Box& bx, int n, bool alloc, bool shared, Arena* ar)
    : DataAllocator{ar}, domain(bx), nvar(n), shared_memory(shared)
{
    if (!this->shared_memory && alloc) define();
}